

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStringConcat
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,
          StringConcat *curr)

{
  bool bVar1;
  Literal *pLVar2;
  element_type *peVar3;
  size_t sVar4;
  size_t sVar5;
  value_type *x;
  Iterator IVar6;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar7;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar8;
  Literal local_1c8;
  value_type *local_1b0;
  Literal *l_1;
  Iterator __end2_1;
  Iterator __begin2_1;
  Literals *__range2_1;
  Literal *l;
  Iterator __end2;
  Iterator __begin2;
  Literals *__range2;
  Literals contents;
  size_t totalSize;
  shared_ptr<wasm::GCData> rightData;
  shared_ptr<wasm::GCData> leftData;
  Literal right;
  undefined1 local_90 [8];
  Literal left;
  undefined1 local_68 [8];
  Flow flow;
  StringConcat *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  flow.breakTo.super_IString.str._M_str = (char *)curr;
  visit((Flow *)local_68,this,curr->left);
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
    left.type.id._0_4_ = 1;
  }
  else {
    pLVar2 = Flow::getSingleValue((Flow *)local_68);
    ::wasm::Literal::Literal((Literal *)local_90,pLVar2);
    visit((Flow *)&right.type,this,*(Expression **)(flow.breakTo.super_IString.str._M_str + 0x18));
    Flow::operator=((Flow *)local_68,(Flow *)&right.type);
    Flow::~Flow((Flow *)&right.type);
    bVar1 = Flow::breaking((Flow *)local_68);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
      left.type.id._0_4_ = 1;
    }
    else {
      pLVar2 = Flow::getSingleValue((Flow *)local_68);
      ::wasm::Literal::Literal
                ((Literal *)
                 &leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 pLVar2);
      ::wasm::Literal::getGCData();
      ::wasm::Literal::getGCData();
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         &rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if ((!bVar1) ||
         (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&totalSize), !bVar1)) {
        (*this->_vptr_ExpressionRunner[2])(this,"null ref");
      }
      peVar3 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
      sVar4 = SmallVector<wasm::Literal,_1UL>::size
                        (&(peVar3->values).super_SmallVector<wasm::Literal,_1UL>);
      peVar3 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&totalSize);
      sVar5 = SmallVector<wasm::Literal,_1UL>::size
                        (&(peVar3->values).super_SmallVector<wasm::Literal,_1UL>);
      contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(sVar4 + sVar5);
      if ((pointer)0x2aaaaa9 <
          contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        (*this->_vptr_ExpressionRunner[3])(this,"allocation failure");
      }
      Literals::Literals((Literals *)&__range2);
      peVar3 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
      sVar4 = SmallVector<wasm::Literal,_1UL>::size
                        (&(peVar3->values).super_SmallVector<wasm::Literal,_1UL>);
      peVar3 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&totalSize);
      sVar5 = SmallVector<wasm::Literal,_1UL>::size
                        (&(peVar3->values).super_SmallVector<wasm::Literal,_1UL>);
      SmallVector<wasm::Literal,_1UL>::reserve
                ((SmallVector<wasm::Literal,_1UL> *)&__range2,sVar4 + sVar5);
      peVar3 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
      IVar6 = SmallVector<wasm::Literal,_1UL>::begin
                        (&(peVar3->values).super_SmallVector<wasm::Literal,_1UL>);
      __end2.
      super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
      .index = (size_t)IVar6.
                       super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                       .parent;
      IVar7 = (IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
               )SmallVector<wasm::Literal,_1UL>::end
                          (&(peVar3->values).super_SmallVector<wasm::Literal,_1UL>);
      while( true ) {
        __end2.
        super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
        .parent = (SmallVector<wasm::Literal,_1UL> *)IVar7.index;
        l = (Literal *)IVar7.parent;
        bVar1 = SmallVector<wasm::Literal,_1UL>::
                IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                ::operator!=((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                              *)&__end2.
                                 super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                 .index,(Iterator *)&l);
        if (!bVar1) break;
        x = SmallVector<wasm::Literal,_1UL>::Iterator::operator*
                      ((Iterator *)
                       &__end2.
                        super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                        .index);
        SmallVector<wasm::Literal,_1UL>::push_back((SmallVector<wasm::Literal,_1UL> *)&__range2,x);
        SmallVector<wasm::Literal,_1UL>::
        IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
        ::operator++((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                      *)&__end2.
                         super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                         .index);
        IVar7.index = (size_t)__end2.
                              super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                              .parent;
        IVar7.parent = (SmallVector<wasm::Literal,_1UL> *)l;
      }
      peVar3 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&totalSize);
      IVar6 = SmallVector<wasm::Literal,_1UL>::begin
                        (&(peVar3->values).super_SmallVector<wasm::Literal,_1UL>);
      __end2_1.
      super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
      .index = (size_t)IVar6.
                       super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                       .parent;
      IVar8 = (IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
               )SmallVector<wasm::Literal,_1UL>::end
                          (&(peVar3->values).super_SmallVector<wasm::Literal,_1UL>);
      while( true ) {
        __end2_1.
        super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
        .parent = (SmallVector<wasm::Literal,_1UL> *)IVar8.index;
        l_1 = (Literal *)IVar8.parent;
        bVar1 = SmallVector<wasm::Literal,_1UL>::
                IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                ::operator!=((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                              *)&__end2_1.
                                 super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                 .index,(Iterator *)&l_1);
        if (!bVar1) break;
        local_1b0 = SmallVector<wasm::Literal,_1UL>::Iterator::operator*
                              ((Iterator *)
                               &__end2_1.
                                super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                .index);
        SmallVector<wasm::Literal,_1UL>::push_back
                  ((SmallVector<wasm::Literal,_1UL> *)&__range2,local_1b0);
        SmallVector<wasm::Literal,_1UL>::
        IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
        ::operator++((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                      *)&__end2_1.
                         super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                         .index);
        IVar8.index = (size_t)__end2_1.
                              super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                              .parent;
        IVar8.parent = (SmallVector<wasm::Literal,_1UL> *)l_1;
      }
      makeGCData(&local_1c8,this,(Literals *)&__range2,
                 (Type)*(uintptr_t *)(flow.breakTo.super_IString.str._M_str + 8));
      Flow::Flow(__return_storage_ptr__,&local_1c8);
      ::wasm::Literal::~Literal(&local_1c8);
      left.type.id._0_4_ = 1;
      Literals::~Literals((Literals *)&__range2);
      std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)&totalSize);
      std::shared_ptr<wasm::GCData>::~shared_ptr
                ((shared_ptr<wasm::GCData> *)
                 &rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      ::wasm::Literal::~Literal
                ((Literal *)
                 &leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
    ::wasm::Literal::~Literal((Literal *)local_90);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringConcat(StringConcat* curr) {
    NOTE_ENTER("StringConcat");
    Flow flow = visit(curr->left);
    if (flow.breaking()) {
      return flow;
    }
    auto left = flow.getSingleValue();
    flow = visit(curr->right);
    if (flow.breaking()) {
      return flow;
    }
    auto right = flow.getSingleValue();
    NOTE_EVAL2(left, right);
    auto leftData = left.getGCData();
    auto rightData = right.getGCData();
    if (!leftData || !rightData) {
      trap("null ref");
    }

    auto totalSize = leftData->values.size() + rightData->values.size();
    if (totalSize >= DataLimit) {
      hostLimit("allocation failure");
    }

    Literals contents;
    contents.reserve(leftData->values.size() + rightData->values.size());
    for (Literal& l : leftData->values) {
      contents.push_back(l);
    }
    for (Literal& l : rightData->values) {
      contents.push_back(l);
    }

    return makeGCData(std::move(contents), curr->type);
  }